

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

bool __thiscall
libcellml::ComponentEntity::removeComponent
          (ComponentEntity *this,ComponentPtr *component,bool searchEncapsulated)

{
  ulong uVar1;
  bool bVar2;
  ComponentEntityImpl *pCVar3;
  ComponentImpl *this_00;
  size_t sVar4;
  element_type *peVar5;
  byte local_71;
  shared_ptr<libcellml::Component> local_58;
  ulong local_48;
  size_t i;
  shared_ptr<libcellml::Component> *local_38;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_28;
  const_iterator result;
  bool status;
  bool searchEncapsulated_local;
  ComponentPtr *component_local;
  ComponentEntity *this_local;
  
  result._M_current._6_1_ = 0;
  result._M_current._7_1_ = searchEncapsulated;
  pCVar3 = pFunc(this);
  local_28._M_current =
       (shared_ptr<libcellml::Component> *)ComponentEntityImpl::findComponent(pCVar3,component);
  pCVar3 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::Component> *)
       std::
       vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
       ::end(&pCVar3->mComponents);
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar2) {
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    this_00 = Component::pFunc(peVar5);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    pCVar3 = pFunc(this);
    local_38 = local_28._M_current;
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase(&pCVar3->mComponents,(const_iterator)local_28._M_current);
    result._M_current._6_1_ = 1;
  }
  else if ((result._M_current._7_1_ & 1) != 0) {
    local_48 = 0;
    while( true ) {
      uVar1 = local_48;
      sVar4 = componentCount(this);
      local_71 = 0;
      if (uVar1 < sVar4) {
        local_71 = result._M_current._6_1_ ^ 0xff;
      }
      if ((local_71 & 1) == 0) break;
      ComponentEntity::component((ComponentEntity *)&local_58,(size_t)this);
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_58);
      result._M_current._6_1_ =
           removeComponent(&peVar5->super_ComponentEntity,component,
                           (bool)(result._M_current._7_1_ & 1));
      std::shared_ptr<libcellml::Component>::~shared_ptr(&local_58);
      local_48 = local_48 + 1;
    }
  }
  return (bool)(result._M_current._6_1_ & 1);
}

Assistant:

bool ComponentEntity::removeComponent(const ComponentPtr &component, bool searchEncapsulated)
{
    bool status = false;
    auto result = pFunc()->findComponent(component);
    if (result != pFunc()->mComponents.end()) {
        component->pFunc()->removeParent();
        pFunc()->mComponents.erase(result);
        status = true;
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = ComponentEntity::component(i)->removeComponent(component, searchEncapsulated);
        }
    }

    return status;
}